

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O2

void al_add_new_bitmap_flag(int flag)

{
  thread_local_state *ptVar1;
  
  ptVar1 = tls_get();
  if (ptVar1 != (thread_local_state *)0x0) {
    ptVar1->new_bitmap_flags = ptVar1->new_bitmap_flags | flag;
  }
  return;
}

Assistant:

void al_add_new_bitmap_flag(int flag)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return;
   tls->new_bitmap_flags |= flag;
}